

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  undefined1 local_310 [32];
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [40];
  picPageAnalyzer picAna;
  ifstream fin;
  allocator local_39;
  string local_38 [8];
  string inputPage;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::ifstream::ifstream
            (&picAna.super_pageAnalyzer.pageContent.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"./testPic.html",_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      cVar2 = std::istream::get();
      std::__cxx11::string::operator+=(local_38,cVar2);
    }
  }
  std::ifstream::close();
  picPageAnalyzer::picPageAnalyzer((picPageAnalyzer *)(local_2b0 + 0x20),(string *)local_38);
  iVar3 = picPageAnalyzer::getCurrentPageNumber((picPageAnalyzer *)(local_2b0 + 0x20));
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  picPageAnalyzer::getPrevPageURL_abi_cxx11_((picPageAnalyzer *)local_2b0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_2b0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_2b0);
  picPageAnalyzer::getNextPageURL_abi_cxx11_((picPageAnalyzer *)local_2d0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_2d0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_2d0);
  picPageAnalyzer::getLossyPicSourceURL_abi_cxx11_((picPageAnalyzer *)local_2f0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_2f0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_2f0);
  picPageAnalyzer::getOriginalPicSourceURL_abi_cxx11_((picPageAnalyzer *)local_310);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_310);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_310);
  picPageAnalyzer::~picPageAnalyzer((picPageAnalyzer *)(local_2b0 + 0x20));
  std::ifstream::~ifstream
            (&picAna.super_pageAnalyzer.pageContent.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    std::string inputPage = std::string("");

    std::ifstream fin("./testPic.html", std::ios::in);
    if(fin.is_open())
    {
        while (!fin.eof())
            inputPage += fin.get();
    }
    fin.close();

    picPageAnalyzer picAna = picPageAnalyzer(inputPage);
    std::cout << picAna.getCurrentPageNumber() << std::endl;
    std::cout << picAna.getPrevPageURL() << std::endl;
    std::cout << picAna.getNextPageURL() << std::endl;
    std::cout << picAna.getLossyPicSourceURL() << std::endl;
    std::cout << picAna.getOriginalPicSourceURL() << std::endl;

    return 0;
}